

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O0

Node __thiscall Jzon::Parser::parseStream(Parser *this,istream *stream)

{
  istream *in_RDX;
  undefined1 local_c0 [8];
  DataQueue data;
  TokenQueue tokens;
  istream *stream_local;
  Parser *this_local;
  Node *node;
  
  std::
  queue<Jzon::Parser::Token,std::deque<Jzon::Parser::Token,std::allocator<Jzon::Parser::Token>>>::
  queue<std::deque<Jzon::Parser::Token,std::allocator<Jzon::Parser::Token>>,void>
            ((queue<Jzon::Parser::Token,std::deque<Jzon::Parser::Token,std::allocator<Jzon::Parser::Token>>>
              *)&data.c.
                 super__Deque_base<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  queue<std::pair<Jzon::Node::Type,std::__cxx11::string>,std::deque<std::pair<Jzon::Node::Type,std::__cxx11::string>,std::allocator<std::pair<Jzon::Node::Type,std::__cxx11::string>>>>
  ::
  queue<std::deque<std::pair<Jzon::Node::Type,std::__cxx11::string>,std::allocator<std::pair<Jzon::Node::Type,std::__cxx11::string>>>,void>
            ((queue<std::pair<Jzon::Node::Type,std::__cxx11::string>,std::deque<std::pair<Jzon::Node::Type,std::__cxx11::string>,std::allocator<std::pair<Jzon::Node::Type,std::__cxx11::string>>>>
              *)local_c0);
  tokenize((Parser *)stream,in_RDX,
           (TokenQueue *)
           &data.c.
            super__Deque_base<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node,(DataQueue *)local_c0);
  assemble(this,(TokenQueue *)stream,
           (DataQueue *)
           &data.c.
            super__Deque_base<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  queue<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~queue((queue<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)local_c0);
  std::
  queue<Jzon::Parser::Token,_std::deque<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>_>
  ::~queue((queue<Jzon::Parser::Token,_std::deque<Jzon::Parser::Token,_std::allocator<Jzon::Parser::Token>_>_>
            *)&data.c.
               super__Deque_base<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Jzon::Node::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return (Node)(Data *)this;
}

Assistant:

Node Parser::parseStream(std::istream &stream)
	{
		TokenQueue tokens;
		DataQueue data;

		tokenize(stream, tokens, data);
		Node node = assemble(tokens, data);

		return node;
	}